

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::NonPackedInt32::_InternalSerialize
          (NonPackedInt32 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  void *data;
  bool bVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  uint8_t *puVar6;
  ulong uVar7;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  int index;
  undefined8 *puVar11;
  
  iVar3 = google::protobuf::internal::SooRep::size
                    ((SooRep *)&(this->field_0)._impl_,
                     (undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x4) ==
                     (undefined1  [24])0x0);
  if (0 < iVar3) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar4 = (uint *)google::protobuf::RepeatedField<int>::Get
                                 (&(this->field_0)._impl_.repeated_int32_,index);
      uVar1 = *puVar4;
      uVar5 = (ulong)(int)uVar1;
      pbVar10 = target + 1;
      uVar8 = 0x4000;
      do {
        pbVar9 = pbVar10;
        pbVar9[-1] = (byte)uVar8 | 0x80;
        pbVar10 = pbVar9 + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar8 >> 7;
      } while (bVar2);
      *pbVar9 = 1;
      uVar7 = uVar5;
      if (0x7f < uVar1) {
        do {
          *pbVar10 = (byte)uVar7 | 0x80;
          uVar5 = uVar7 >> 7;
          pbVar10 = pbVar10 + 1;
          bVar2 = 0x3fff < uVar7;
          uVar7 = uVar5;
        } while (bVar2);
      }
      *pbVar10 = (byte)uVar5;
      target = pbVar10 + 1;
      index = index + 1;
    } while (index != iVar3);
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    data = *(void **)((uVar5 & 0xfffffffffffffffe) + 8);
    uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar5 & 1) == 0) {
      puVar11 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar11 = (undefined8 *)((uVar5 & 0xfffffffffffffffe) + 8);
    }
    uVar1 = *(uint *)(puVar11 + 1);
    if ((long)stream->end_ - (long)target < (long)(int)uVar1) {
      puVar6 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,uVar1,target)
      ;
      return puVar6;
    }
    memcpy(target,data,(ulong)uVar1);
    target = target + (int)uVar1;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL NonPackedInt32::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const NonPackedInt32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.NonPackedInt32)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 repeated_int32 = 2048;
  for (int i = 0, n = this_._internal_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        2048, this_._internal_repeated_int32().Get(i), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.NonPackedInt32)
  return target;
}